

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
::PerformDefaultAction
          (FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
           *this,ArgumentTuple *args,string *call_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_00;
  pointer pcVar3;
  bool bVar4;
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_01;
  _Alloc_hider _Var5;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar6;
  string message;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ArgumentTuple local_58;
  
  ppvVar6 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar6 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar3 = (call_description->_M_dataplus)._M_p;
      local_78[0] = &local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar3,pcVar3 + call_description->_M_string_length);
      std::__cxx11::string::append((char *)local_78);
      _Var5._M_p = (pointer)local_78[0];
      if (local_78[0] == &local_68) {
        return;
      }
      goto LAB_001c0d3c;
    }
    this_00 = (OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
               *)ppvVar6[-1];
    ppvVar6 = ppvVar6 + -1;
    bVar4 = OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
            ::Matches(this_00,args);
  } while (!bVar4);
  this_01 = OnCallSpec<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
            ::GetAction(this_00);
  local_58.
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  .super__Tuple_impl<1UL,_ot::commissioner::Error>.
  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mCode =
       (args->
       super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
       ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
       super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mCode;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_58.
                      super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                      .super__Tuple_impl<1UL,_ot::commissioner::Error>.
                      super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage +
              0x10);
  local_58.
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  .super__Tuple_impl<1UL,_ot::commissioner::Error>.
  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p =
       (args->
       super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
       ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
       super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p;
  paVar1 = &(args->
            super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
            ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
            super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.
         super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
         .super__Tuple_impl<1UL,_ot::commissioner::Error>.
         super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus.
         _M_p == paVar1) {
    local_58.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(args->
                  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                  ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
                  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.
                  field_2 + 8);
    local_58.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_58.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
    .super__Tuple_impl<1UL,_ot::commissioner::Error>.
    super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58.
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  .super__Tuple_impl<1UL,_ot::commissioner::Error>.
  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_string_length =
       (args->
       super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
       ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
       super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_string_length;
  (args->
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus._M_p =
       (pointer)paVar1;
  (args->
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_string_length = 0;
  (args->
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ).super__Tuple_impl<1UL,_ot::commissioner::Error>.
  super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.field_2._M_local_buf
  [0] = '\0';
  local_58.
  super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  .super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>.
  _M_head_impl = (args->
                 super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                 ).
                 super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
                 ._M_head_impl;
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  ::Perform(this_01,&local_58);
  _Var5._M_p = local_58.
               super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
               .super__Tuple_impl<1UL,_ot::commissioner::Error>.
               super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage.
               _M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.
         super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
         .super__Tuple_impl<1UL,_ot::commissioner::Error>.
         super__Head_base<1UL,_ot::commissioner::Error,_false>._M_head_impl.mMessage._M_dataplus.
         _M_p != paVar2) {
LAB_001c0d3c:
    operator_delete(_Var5._M_p);
  }
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }